

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O0

void ScaleARGBFilterCols_SSSE3(uint8_t *dst_argb,uint8_t *src_argb,int dst_width,int x,int dx)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uvec8 auVar4;
  uvec8 auVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ushort uVar20;
  undefined1 auVar13 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  intptr_t x1;
  intptr_t x0;
  int dx_local;
  int x_local;
  int dst_width_local;
  uint8_t *src_argb_local;
  uint8_t *dst_argb_local;
  
  auVar5 = libyuv::kShuffleFractions;
  auVar4 = libyuv::kShuffleColARGB;
  auVar22 = ZEXT416((uint)x);
  uVar6 = (ulong)(ushort)((uint)x >> 0x10);
  iVar7 = dst_width + -2;
  if (1 < dst_width) {
    auVar12._4_4_ = x + dx;
    auVar12._0_4_ = x;
    auVar12._8_8_ = 0;
    uVar10 = (ushort)((uint)(x + dx) >> 0x10);
    iVar8 = iVar7;
    do {
      auVar22._0_4_ = auVar12._0_4_ + dx * 2;
      auVar22._4_4_ = auVar12._4_4_ + dx * 2;
      auVar22._8_4_ = auVar12._8_4_;
      auVar22._12_4_ = auVar12._12_4_;
      auVar21._0_2_ = auVar12._0_2_ >> 9;
      auVar21._2_2_ = auVar12._2_2_ >> 9;
      auVar21._4_2_ = auVar12._4_2_ >> 9;
      auVar21._6_2_ = auVar12._6_2_ >> 9;
      auVar21._8_2_ = auVar12._8_2_ >> 9;
      auVar21._10_2_ = auVar12._10_2_ >> 9;
      auVar21._12_2_ = auVar12._12_2_ >> 9;
      auVar21._14_2_ = auVar12._14_2_ >> 9;
      auVar11._8_8_ = *(undefined8 *)(src_argb + (ulong)uVar10 * 4);
      auVar11._0_8_ = *(undefined8 *)(src_argb + uVar6 * 4);
      auVar21 = pshufb(auVar21,(undefined1  [16])auVar5);
      auVar12 = pshufb(auVar11,(undefined1  [16])auVar4);
      auVar2[8] = 0x7f;
      auVar2._0_8_ = 0x7f007f007f007f;
      auVar2[9] = 0;
      auVar2[10] = 0x7f;
      auVar2[0xb] = 0;
      auVar2[0xc] = 0x7f;
      auVar2[0xd] = 0;
      auVar2[0xe] = 0x7f;
      auVar2[0xf] = 0;
      auVar12 = pmaddubsw(auVar12,auVar21 ^ auVar2);
      uVar9 = auVar12._0_2_ >> 7;
      uVar14 = auVar12._2_2_ >> 7;
      uVar15 = auVar12._4_2_ >> 7;
      uVar16 = auVar12._6_2_ >> 7;
      uVar17 = auVar12._8_2_ >> 7;
      uVar18 = auVar12._10_2_ >> 7;
      uVar19 = auVar12._12_2_ >> 7;
      uVar20 = auVar12._14_2_ >> 7;
      uVar6 = (ulong)(ushort)((uint)auVar22._0_4_ >> 0x10);
      uVar10 = (ushort)((uint)auVar22._4_4_ >> 0x10);
      *(ulong *)dst_argb =
           CONCAT17((uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20),
                    CONCAT16((uVar19 != 0) * (uVar19 < 0x100) * (char)uVar19 - (0xff < uVar19),
                             CONCAT15((uVar18 != 0) * (uVar18 < 0x100) * (char)uVar18 -
                                      (0xff < uVar18),
                                      CONCAT14((uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 -
                                               (0xff < uVar17),
                                               CONCAT13((uVar16 != 0) * (uVar16 < 0x100) *
                                                        (char)uVar16 - (0xff < uVar16),
                                                        CONCAT12((uVar15 != 0) * (uVar15 < 0x100) *
                                                                 (char)uVar15 - (0xff < uVar15),
                                                                 CONCAT11((uVar14 != 0) *
                                                                          (uVar14 < 0x100) *
                                                                          (char)uVar14 -
                                                                          (0xff < uVar14),
                                                                          (uVar9 != 0) *
                                                                          (uVar9 < 0x100) *
                                                                          (char)uVar9 -
                                                                          (0xff < uVar9))))))));
      dst_argb = dst_argb + 8;
      iVar7 = iVar8 + -2;
      bVar1 = 1 < iVar8;
      auVar12 = auVar22;
      iVar8 = iVar7;
    } while (bVar1);
  }
  if (SCARRY4(iVar7,1) == iVar7 + 1 < 0) {
    auVar23._0_2_ = auVar22._0_2_ >> 9;
    auVar23._2_2_ = auVar22._2_2_ >> 9;
    auVar23._4_2_ = auVar22._4_2_ >> 9;
    auVar23._6_2_ = auVar22._6_2_ >> 9;
    auVar23._8_2_ = auVar22._8_2_ >> 9;
    auVar23._10_2_ = auVar22._10_2_ >> 9;
    auVar23._12_2_ = auVar22._12_2_ >> 9;
    auVar23._14_2_ = auVar22._14_2_ >> 9;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(src_argb + uVar6 * 4);
    auVar12 = pshufb(auVar23,(undefined1  [16])auVar5);
    auVar22 = pshufb(auVar13,(undefined1  [16])auVar4);
    auVar3[8] = 0x7f;
    auVar3._0_8_ = 0x7f007f007f007f;
    auVar3[9] = 0;
    auVar3[10] = 0x7f;
    auVar3[0xb] = 0;
    auVar3[0xc] = 0x7f;
    auVar3[0xd] = 0;
    auVar3[0xe] = 0x7f;
    auVar3[0xf] = 0;
    auVar22 = pmaddubsw(auVar22,auVar12 ^ auVar3);
    uVar10 = auVar22._0_2_ >> 7;
    uVar9 = auVar22._2_2_ >> 7;
    uVar14 = auVar22._4_2_ >> 7;
    uVar15 = auVar22._6_2_ >> 7;
    *(uint *)dst_argb =
         CONCAT13((uVar15 != 0) * (uVar15 < 0x100) * (char)uVar15 - (0xff < uVar15),
                  CONCAT12((uVar14 != 0) * (uVar14 < 0x100) * (char)uVar14 - (0xff < uVar14),
                           CONCAT11((uVar9 != 0) * (uVar9 < 0x100) * (char)uVar9 - (0xff < uVar9),
                                    (uVar10 != 0) * (uVar10 < 0x100) * (char)uVar10 -
                                    (0xff < uVar10))));
  }
  return;
}

Assistant:

void ScaleARGBFilterCols_SSSE3(uint8_t* dst_argb,
                               const uint8_t* src_argb,
                               int dst_width,
                               int x,
                               int dx) {
  intptr_t x0, x1;
  asm volatile(
      "movdqa      %0,%%xmm4                     \n"
      "movdqa      %1,%%xmm5                     \n"
      :
      : "m"(kShuffleColARGB),   // %0
        "m"(kShuffleFractions)  // %1
  );

  asm volatile(
      "movd        %5,%%xmm2                     \n"
      "movd        %6,%%xmm3                     \n"
      "pcmpeqb     %%xmm6,%%xmm6                 \n"
      "psrlw       $0x9,%%xmm6                   \n"
      "pextrw      $0x1,%%xmm2,%k3               \n"
      "sub         $0x2,%2                       \n"
      "jl          29f                           \n"
      "movdqa      %%xmm2,%%xmm0                 \n"
      "paddd       %%xmm3,%%xmm0                 \n"
      "punpckldq   %%xmm0,%%xmm2                 \n"
      "punpckldq   %%xmm3,%%xmm3                 \n"
      "paddd       %%xmm3,%%xmm3                 \n"
      "pextrw      $0x3,%%xmm2,%k4               \n"

      LABELALIGN
      "2:                                        \n"
      "movdqa      %%xmm2,%%xmm1                 \n"
      "paddd       %%xmm3,%%xmm2                 \n"
      "movq        0x00(%1,%3,4),%%xmm0          \n"
      "psrlw       $0x9,%%xmm1                   \n"
      "movhps      0x00(%1,%4,4),%%xmm0          \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "pxor        %%xmm6,%%xmm1                 \n"
      "pmaddubsw   %%xmm1,%%xmm0                 \n"
      "psrlw       $0x7,%%xmm0                   \n"
      "pextrw      $0x1,%%xmm2,%k3               \n"
      "pextrw      $0x3,%%xmm2,%k4               \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movq        %%xmm0,(%0)                   \n"
      "lea         0x8(%0),%0                    \n"
      "sub         $0x2,%2                       \n"
      "jge         2b                            \n"

      LABELALIGN
      "29:                                       \n"
      "add         $0x1,%2                       \n"
      "jl          99f                           \n"
      "psrlw       $0x9,%%xmm2                   \n"
      "movq        0x00(%1,%3,4),%%xmm0          \n"
      "pshufb      %%xmm5,%%xmm2                 \n"
      "pshufb      %%xmm4,%%xmm0                 \n"
      "pxor        %%xmm6,%%xmm2                 \n"
      "pmaddubsw   %%xmm2,%%xmm0                 \n"
      "psrlw       $0x7,%%xmm0                   \n"
      "packuswb    %%xmm0,%%xmm0                 \n"
      "movd        %%xmm0,(%0)                   \n"

      LABELALIGN
      "99:                                       \n"  // clang-format error.

      : "+r"(dst_argb),    // %0
        "+r"(src_argb),    // %1
        "+rm"(dst_width),  // %2
        "=&r"(x0),         // %3
        "=&r"(x1)          // %4
      : "rm"(x),           // %5
        "rm"(dx)           // %6
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5", "xmm6");
}